

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall SummedArea_NonCellAligned_Test::TestBody(SummedArea_NonCellAligned_Test *this)

{
  undefined1 auVar1 [16];
  Bounds2f BVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  Allocator alloc;
  byte bVar5;
  int iVar6;
  uint uVar7;
  size_t __n;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  char *message;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Float FVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Float sampledResult;
  Hammersley2DIter __begin2;
  AssertionResult gtest_ar;
  double s;
  Bounds2f b;
  SummedAreaTable sat;
  Message local_d8;
  float local_d0;
  float local_cc;
  string local_c8;
  Array2D<float> local_a8;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  long local_78;
  AssertHelper local_70;
  double local_68;
  Bounds2f local_60;
  Array2D<double> local_50;
  undefined1 extraout_var_00 [56];
  
  uVar13 = 0x853c49e6748fea9b;
  local_78 = 0;
  do {
    uVar11 = *(ulong *)((long)&DAT_0055b960 + local_78);
    local_a8.allocator.memoryResource = pstd::pmr::new_delete_resource();
    uVar9 = (uint)(uVar11 >> 0x20);
    uVar12 = (uint)uVar11;
    local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)uVar12 >> 0x1f & uVar12;
    uVar8 = 0;
    if (0 < (int)uVar12) {
      uVar8 = uVar11 & 0xffffffff;
    }
    uVar10 = 0;
    if (uVar9 != 0 && -1 < (long)uVar11) {
      uVar10 = (ulong)uVar9;
    }
    local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar9 >> 0x1f & uVar9;
    local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int> =
         (Tuple2<pbrt::Point2,_int>)(uVar8 | uVar10 << 0x20);
    uVar7 = -uVar12;
    if (0 < (int)uVar12) {
      uVar7 = uVar12;
    }
    uVar12 = -uVar9;
    if (0 < (int)uVar9) {
      uVar12 = uVar9;
    }
    if (uVar12 * uVar7 == 0) {
      local_a8.values = (float *)0x0;
    }
    else {
      __n = (ulong)(uVar12 * uVar7) << 2;
      iVar4 = (*(local_a8.allocator.memoryResource)->_vptr_memory_resource[2])
                        (local_a8.allocator.memoryResource,__n,4);
      local_a8.values = (float *)CONCAT44(extraout_var,iVar4);
      memset(local_a8.values,0,__n);
    }
    if (local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y <
        local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y) {
      iVar4 = 0;
      uVar9 = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
              local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      do {
        if (0 < (int)uVar9) {
          uVar11 = 0;
          do {
            do {
              uVar12 = (uint)(uVar13 >> 0x2d) ^ (uint)(uVar13 >> 0x1b);
              bVar5 = (byte)(uVar13 >> 0x3b);
              uVar12 = uVar12 >> bVar5 | uVar12 << 0x20 - bVar5;
              uVar13 = uVar13 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
            } while ((int)uVar12 < 0);
            iVar6 = (int)uVar11;
            uVar11 = uVar11 + 1;
            local_a8.values
            [(int)((iVar6 - local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) +
                  (iVar4 - local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y) * uVar9)] =
                 (float)(uVar12 & 0x1f);
          } while (uVar11 != uVar9);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                        local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SummedAreaTable::SummedAreaTable((SummedAreaTable *)&local_50,&local_a8,alloc);
    auVar15 = vpmovsxbq_avx(ZEXT216(0x2d1b));
    auVar23 = vpmovsxbq_avx(ZEXT216(0x1b2d));
    auVar30._8_4_ = 0x3f7fffff;
    auVar30._0_8_ = 0x3f7fffff3f7fffff;
    auVar30._12_4_ = 0x3f7fffff;
    local_c8._M_dataplus._M_p = (pointer)0x186a000000000;
    uVar11 = uVar13 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar13;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar11;
    auVar17 = vpunpcklqdq_avx(auVar17,auVar14);
    uVar13 = uVar11 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar14 = vpsrlvq_avx2(auVar17,auVar15);
    auVar18 = vpsrlvq_avx2(auVar17,auVar23);
    auVar17 = vpsrlq_avx(auVar17,0x3b);
    auVar17 = vpshufd_avx(auVar17,0xe8);
    auVar14 = vpshufd_avx(auVar14 ^ auVar18,0xe8);
    auVar17 = vprorvd_avx512vl(auVar14,auVar17);
    auVar14 = vcvtudq2ps_avx512vl(auVar17);
    uVar11 = uVar13 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar13;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar11;
    auVar17 = vpunpcklqdq_avx(auVar22,auVar26);
    auVar18._0_4_ = auVar14._0_4_ * 2.3283064e-10;
    auVar18._4_4_ = auVar14._4_4_ * 2.3283064e-10;
    auVar18._8_4_ = auVar14._8_4_ * 2.3283064e-10;
    auVar18._12_4_ = auVar14._12_4_ * 2.3283064e-10;
    auVar15 = vpsrlvq_avx2(auVar17,auVar15);
    auVar14 = vpsrlvq_avx2(auVar17,auVar23);
    auVar23 = vpsrlq_avx(auVar17,0x3b);
    auVar23 = vpshufd_avx(auVar23,0xe8);
    uVar13 = uVar11 * 0x5851f42d4c957f2d + 0xda3e39cb94b95bdb;
    auVar17 = vpshufd_avx(auVar15 ^ auVar14,0xe8);
    auVar15 = vminps_avx(auVar18,auVar30);
    auVar23 = vprorvd_avx512vl(auVar17,auVar23);
    auVar23 = vcvtudq2ps_avx512vl(auVar23);
    auVar24._0_4_ = auVar23._0_4_ * 2.3283064e-10;
    auVar24._4_4_ = auVar23._4_4_ * 2.3283064e-10;
    auVar24._8_4_ = auVar23._8_4_ * 2.3283064e-10;
    auVar24._12_4_ = auVar23._12_4_ * 2.3283064e-10;
    auVar23 = vminps_avx(auVar24,auVar30);
    auVar17 = vminps_avx(auVar23,auVar15);
    auVar15 = vmaxps_avx(auVar23,auVar15);
    local_60 = (Bounds2f)vmovlhps_avx(auVar17,auVar15);
    local_d0 = 0.0;
    do {
      auVar21._0_8_ = pbrt::detail::Hammersley2DIter::operator*((Hammersley2DIter *)&local_c8);
      BVar2 = local_60;
      auVar21._8_56_ = extraout_var_00;
      auVar15._8_4_ = 0x3f800000;
      auVar15._0_8_ = 0x3f8000003f800000;
      auVar15._12_4_ = 0x3f800000;
      auVar27._8_8_ = 0;
      auVar27._0_4_ = local_60.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar27._4_4_ = local_60.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      local_60.pMin = BVar2.pMin.super_Tuple2<pbrt::Point2,_float>;
      auVar25._8_8_ = 0;
      auVar25._0_4_ = local_60.pMin.super_Tuple2<pbrt::Point2,_float>.x;
      auVar25._4_4_ = local_60.pMin.super_Tuple2<pbrt::Point2,_float>.y;
      auVar15 = vsubps_avx(auVar15,auVar21._0_16_);
      auVar23._0_4_ = auVar21._0_4_ * BVar2.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar23._4_4_ = auVar21._4_4_ * BVar2.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      auVar23._8_4_ = extraout_var_00._0_4_ * 0.0;
      auVar23._12_4_ = extraout_var_00._4_4_ * 0.0;
      auVar17 = vfmadd231ps_fma(auVar23,auVar25,auVar15);
      auVar28._8_8_ = 0;
      auVar28._0_4_ = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar28._4_4_ = local_a8.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar29._8_8_ = 0;
      auVar29._0_4_ = local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar29._4_4_ = local_a8.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar23 = vpsubd_avx(auVar28,auVar29);
      auVar15 = vcvtdq2ps_avx(auVar23);
      auVar19._0_4_ = (int)(auVar17._0_4_ * auVar15._0_4_);
      auVar19._4_4_ = (int)(auVar17._4_4_ * auVar15._4_4_);
      auVar19._8_4_ = (int)(auVar17._8_4_ * auVar15._8_4_);
      auVar19._12_4_ = (int)(auVar17._12_4_ * auVar15._12_4_);
      auVar17 = vpsubd_avx(auVar19,auVar29);
      auVar15 = vpshufd_avx(auVar17,0x55);
      auVar15 = vpmulld_avx(auVar15,auVar23);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      local_d0 = local_d0 + local_a8.values[auVar15._0_4_];
      iVar4 = (int)local_c8._M_dataplus._M_p + 1;
      local_c8._M_dataplus._M_p._0_4_ = iVar4;
      local_60 = BVar2;
    } while (iVar4 != 100000);
    auVar23 = vsubps_avx(auVar27,auVar25);
    auVar15 = vmovshdup_avx(auVar23);
    local_cc = (auVar23._0_4_ * auVar15._0_4_ * local_d0) / 100000.0;
    FVar16 = pbrt::SummedAreaTable::Integral((SummedAreaTable *)&local_50,&local_60);
    local_68 = (double)FVar16;
    if ((local_cc != FVar16) || (NAN(local_cc) || NAN(FVar16))) {
      local_d8.ss_.ptr_._0_4_ = 0x3a83126f;
      auVar20._0_8_ = ((double)local_cc - local_68) / (double)local_cc;
      auVar20._8_8_ = 0;
      auVar1._8_8_ = 0x7fffffffffffffff;
      auVar1._0_8_ = 0x7fffffffffffffff;
      auVar15 = vandpd_avx512vl(auVar20,auVar1);
      local_c8._M_dataplus._M_p = (pointer)vmovlpd_avx(auVar15);
      testing::internal::CmpHelperLT<double,float>
                (local_88,"std::abs((sampledResult - s) / sampledResult)","1e-3f",
                 (double *)&local_c8,(float *)&local_d8);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message(&local_d8);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        local_c8._M_string_length = 0;
        local_c8.field_2._M_local_buf[0] = '\0';
        pbrt::detail::stringPrintfRecursive<float&,double&>
                  (&local_c8,"sampled %f s %f",&local_cc,&local_68);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_d8.ss_.ptr_._4_4_,local_d8.ss_.ptr_._0_4_) + 0x10),
                   local_c8._M_dataplus._M_p,local_c8._M_string_length);
        message = "";
        if (local_80.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((local_80.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x53d,message);
        testing::internal::AssertHelper::operator=(&local_70,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,
                          CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                                   local_c8.field_2._M_local_buf[0]) + 1);
        }
        if (CONCAT44(local_d8.ss_.ptr_._4_4_,local_d8.ss_.ptr_._0_4_) != 0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) &&
             ((long *)CONCAT44(local_d8.ss_.ptr_._4_4_,local_d8.ss_.ptr_._0_4_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_d8.ss_.ptr_._4_4_,local_d8.ss_.ptr_._0_4_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    pbrt::Array2D<double>::~Array2D(&local_50);
    pbrt::Array2D<float>::~Array2D(&local_a8);
    local_78 = local_78 + 8;
  } while (local_78 != 0x30);
  return;
}

Assistant:

TEST(SummedArea, NonCellAligned) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        Bounds2f b({rng.Uniform<Float>(), rng.Uniform<Float>()},
                   {rng.Uniform<Float>(), rng.Uniform<Float>()});

        Float sampledSum = 0;
        int nSamples = 100000;
        for (Point2f u : Hammersley2D(nSamples)) {
            Point2f p = b.Lerp(u);
            Point2i pi(p.x * v.xSize(), p.y * v.ySize());
            sampledSum += v[pi];
        }
        Float sampledResult = sampledSum * b.Area() / nSamples;

        double s = sat.Integral(b);
        if (sampledResult != s)
            EXPECT_LT(std::abs((sampledResult - s) / sampledResult), 1e-3f)
                << StringPrintf("sampled %f s %f", sampledResult, s);
    }
}